

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.h
# Opt level: O2

void __thiscall
BloomFilter<long_long>::BloomFilter(BloomFilter<long_long> *this,size_t m,size_t n,int seed,int k)

{
  int iVar1;
  allocator_type local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  this->_vptr_BloomFilter = (_func_int **)&PTR__BloomFilter_00111d18;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->_hashes).
  super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_hashes).
  super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_hashes).
  super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_max = n;
  this->_length = m;
  this->_seed = seed;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,m,&local_59);
  std::vector<bool,_std::allocator<bool>_>::operator=(&this->_bits,&local_58);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&local_58);
  iVar1 = 0;
  if (0 < k) {
    iVar1 = k;
  }
  while (iVar1 != 0) {
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)MurmurHash64A;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = seed;
    std::
    vector<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>,std::allocator<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>>>
    ::
    emplace_back<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>>
              ((vector<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>,std::allocator<std::_Bind<unsigned_long(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(void_const*,int,unsigned_int)>>>
                *)&this->_hashes,
               (_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>
                *)&local_58);
    seed = seed + 1;
    iVar1 = iVar1 + -1;
  }
  return;
}

Assistant:

BloomFilter<T>::BloomFilter(size_t m, size_t n, int seed, int k) :_length(m), _max(n), _seed(seed) {
    _bits = vector<bool>(m);
    for (int i = 0; i < k; i++) {
        _hashes.push_back(std::bind(MurmurHash64A, _1, _2, seed + i));
    }
}